

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O3

void m256v_swap_rows(m256v *M,int r1,int r2)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  if ((r1 != r2) && (0 < M->n_col)) {
    lVar3 = (long)r2 * M->rstride;
    lVar4 = (long)r1 * M->rstride;
    iVar5 = 0;
    do {
      puVar2 = M->e;
      uVar1 = puVar2[lVar4];
      puVar2[lVar4] = puVar2[lVar3];
      M->e[lVar3] = uVar1;
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar5 < M->n_col);
  }
  return;
}

Assistant:

void m256v_swap_rows(m256v* M, int r1, int r2)
{
	if (r1 == r2)
		return;

	size_t o1 = get_el_offs(M, r1, 0);
	size_t o2 = get_el_offs(M, r2, 0);
	for (int i = 0; i < M->n_col; ++i) {
		const uint8_t sw = M->e[o1];
		M->e[o1] = M->e[o2];
		M->e[o2] = sw;
		++o1;
		++o2;
	}
}